

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void hash_table_increase_buckets(hash_table_t *table)

{
  uint uVar1;
  hash_table_bucket_t *phVar2;
  hash_table_bucket_t *phVar3;
  undefined8 *puVar4;
  int iVar5;
  hash_table_bucket_t *phVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  
  uVar1 = table->n_buckets;
  if (uVar1 == 0) {
    __assert_fail("table->n_buckets > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/util.c"
                  ,0xfe,"void hash_table_increase_buckets(hash_table_t *)");
  }
  uVar11 = (ulong)(uVar1 * 2 + 1);
  uVar14 = 0x10;
  phVar6 = (hash_table_bucket_t *)calloc(uVar11,0x10);
  if (phVar6 == (hash_table_bucket_t *)0x0) {
    hash_table_increase_buckets_cold_1();
    lVar7 = *(long *)(uVar11 + 0x38);
    lVar9 = (**(code **)(uVar11 + 0x28))(uVar14);
    puVar4 = *(undefined8 **)
              (*(long *)(uVar11 + 8) + 8 +
              ((ulong)(lVar9 * lVar7 + *(long *)(uVar11 + 0x40)) >>
               (-*(char *)(uVar11 + 0x48) & 0x3fU) & 0xffffffff) * 0x10);
    while ((puVar4 != (undefined8 *)0x0 &&
           (iVar5 = (**(code **)(uVar11 + 0x20))(uVar14,*puVar4), iVar5 == 0))) {
      puVar4 = (undefined8 *)puVar4[1];
    }
    return;
  }
  phVar6->next = table->allocs;
  table->allocs = phVar6;
  lVar7 = table->seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar16._0_8_ = lVar7;
  auVar16._12_4_ = 0x45300000;
  dVar17 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 5.421010862427522e-20 *
           1.8446744073709552e+19;
  uVar15 = (ulong)dVar17;
  uVar15 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15;
  sVar8 = lVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  auVar18._8_4_ = (int)(sVar8 >> 0x20);
  auVar18._0_8_ = sVar8;
  auVar18._12_4_ = 0x45300000;
  dVar17 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)) * 5.421010862427522e-20 *
           1.8446744073709552e+19;
  uVar11 = (ulong)dVar17;
  table->seed = sVar8;
  uVar11 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
  iVar5 = uint32_log2(uVar1 * 2);
  uVar10 = table->n_buckets;
  if (uVar10 != 0) {
    uVar12 = 0;
    do {
      phVar3 = table->buckets[uVar12].next;
      while (phVar3 != (hash_table_bucket_t *)0x0) {
        phVar2 = phVar3->next;
        sVar8 = (*table->hash)(phVar3->data);
        uVar13 = sVar8 * uVar15 + uVar11 >> (0x40U - (char)iVar5 & 0x3f) & 0xffffffff;
        phVar3->next = phVar6[uVar13 + 1].next;
        phVar6[uVar13 + 1].next = phVar3;
        phVar3 = phVar2;
      }
      uVar12 = uVar12 + 1;
      uVar10 = table->n_buckets;
    } while (uVar12 < uVar10);
  }
  uVar12 = (ulong)(uVar10 - 1);
  if (uVar10 - 1 != 0) {
    uVar13 = uVar12;
    phVar3 = table->buckets;
    do {
      phVar3->next = phVar3 + 1;
      phVar3->data = (void *)0x0;
      uVar13 = uVar13 - 1;
      phVar3 = phVar3 + 1;
    } while (uVar13 != 0);
  }
  phVar3 = table->buckets;
  phVar3[uVar12].next = table->free_buckets;
  phVar3[uVar12].data = (void *)0x0;
  table->free_buckets = phVar3;
  table->buckets = phVar6 + 1;
  table->n_buckets = uVar1 * 2;
  (table->ghash).mult = uVar15;
  (table->ghash).add = uVar11;
  (table->ghash).log2_buckets = iVar5;
  return;
}

Assistant:

static void hash_table_increase_buckets( hash_table_t * table )
{
    unsigned i, j, new_n_buckets ;
    hash_table_bucket_t * new_table ;
    universal_hash_function_t new_ghash;
    assert( table->n_buckets > 0 );
    
    new_table = calloc(table->n_buckets * 2 + 1, sizeof(hash_table_bucket_t));
    if (!new_table) {
        fprintf(stderr, "hash_table_increase_buckets: "
                "insufficient memory\n");
        abort();
    }
    new_table->next = table->allocs;
    table->allocs = new_table;
    new_table += 1;

    new_n_buckets = 2 * table->n_buckets;
    new_ghash = new_universal_hash_function(&table->seed, new_n_buckets);
    
    /* rehash existing items*/
    for ( i = 0; i < table->n_buckets ; ++i ) {
        hash_table_bucket_t * b = table->buckets[i].next;
        while (b) {
            hash_table_bucket_t * c = b->next;
            j = (unsigned) hash( new_ghash, (* table->hash )( b->data ) );
            
            b->next = new_table[j].next;
            new_table[j].next = b;

            b = c;
        }
    }

    /* return old buckets to free list */
    for ( i = 0; i < table->n_buckets - 1; ++i ) {
        table->buckets[i].next = &table->buckets[i+1];
        table->buckets[i].data = NULL;
    } 
    table->buckets[table->n_buckets-1].next = table->free_buckets;
    table->buckets[table->n_buckets-1].data = NULL;
    table->free_buckets = table->buckets;

    /* commit changes */
    table->buckets = new_table;
    table->n_buckets = new_n_buckets;
    table->ghash = new_ghash;
}